

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * cuddUniqueLookup(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  DdSubtable *subtable;
  DdNode *looking;
  DdNodePtr *nodelist;
  uint level;
  int posn;
  DdNode *E_local;
  DdNode *T_local;
  int index_local;
  DdManager *unique_local;
  
  if (index < unique->size) {
    subtable = (DdSubtable *)
               unique->subtables[(uint)unique->perm[index]].nodelist
               [(int)((((uint)(*(long *)(((ulong)T & 0xfffffffffffffffe) + 0x20) << 1) | (uint)T & 1
                       ) * 0xc00005 +
                      ((uint)(*(long *)(((ulong)E & 0xfffffffffffffffe) + 0x20) << 1) | (uint)E & 1)
                      ) * 0x40f1f9 >>
                     ((byte)unique->subtables[(uint)unique->perm[index]].shift & 0x1f))];
    while (T < *(DdNode **)&subtable->keys) {
      uVar1._0_4_ = subtable->shift;
      uVar1._4_4_ = subtable->slots;
      subtable = (DdSubtable *)(uVar1 & 0xfffffffffffffffe);
    }
    while( true ) {
      bVar3 = false;
      if (T == *(DdNode **)&subtable->keys) {
        bVar3 = E < *(DdNode **)&subtable->dead;
      }
      if (!bVar3) break;
      uVar2._0_4_ = subtable->shift;
      uVar2._4_4_ = subtable->slots;
      subtable = (DdSubtable *)(uVar2 & 0xfffffffffffffffe);
    }
    if ((*(DdNode **)&subtable->keys == T) && (*(DdNode **)&subtable->dead == E)) {
      unique_local = (DdManager *)subtable;
    }
    else {
      unique_local = (DdManager *)0x0;
    }
  }
  else {
    unique_local = (DdManager *)0x0;
  }
  return &unique_local->sentinel;
}

Assistant:

static DdNode *
cuddUniqueLookup(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    int posn;
    unsigned int level;
    DdNodePtr *nodelist;
    DdNode *looking;
    DdSubtable *subtable;

    if (index >= unique->size) {
        return(NULL);
    }

    level = unique->perm[index];
    subtable = &(unique->subtables[level]);

#ifdef DD_DEBUG
    assert(level < (unsigned) cuddI(unique,T->index));
    assert(level < (unsigned) cuddI(unique,Cudd_Regular(E)->index));
#endif

    posn = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
    nodelist = subtable->nodelist;
    looking = nodelist[posn];

    while (T < cuddT(looking)) {
        looking = Cudd_Regular(looking->next);
    }
    while (T == cuddT(looking) && E < cuddE(looking)) {
        looking = Cudd_Regular(looking->next);
    }
    if (cuddT(looking) == T && cuddE(looking) == E) {
        return(looking);
    }

    return(NULL);

}